

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::insertpoint_abort(tetgenmesh *this,face *splitseg,insertvertexflags *ivf)

{
  uint *puVar1;
  arraypool *paVar2;
  long lVar3;
  arraypool *paVar4;
  long lVar5;
  long lVar6;
  
  paVar2 = this->caveoldtetlist;
  lVar6 = 0;
  lVar5 = paVar2->objects;
  if (paVar2->objects < 1) {
    lVar5 = lVar6;
  }
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    lVar3 = *(long *)(paVar2->toparray[(uint)lVar6 >> ((byte)paVar2->log2objectsperblock & 0x1f)] +
                     (long)paVar2->objectbytes *
                     (long)(int)(paVar2->objectsperblockmark & (uint)lVar6));
    puVar1 = (uint *)(lVar3 + (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 & 0xfffffffe;
    puVar1 = (uint *)(lVar3 + (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 & 0xfffffffd;
  }
  paVar4 = this->cavebdrylist;
  lVar6 = 0;
  lVar5 = paVar4->objects;
  if (paVar4->objects < 1) {
    lVar5 = lVar6;
  }
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    puVar1 = (uint *)(*(long *)(paVar4->toparray
                                [(uint)lVar6 >> ((byte)paVar4->log2objectsperblock & 0x1f)] +
                               (long)paVar4->objectbytes *
                               (long)(int)(paVar4->objectsperblockmark & (uint)lVar6)) +
                     (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 & 0xfffffffd;
  }
  this->cavetetlist->objects = 0;
  paVar4->objects = 0;
  paVar2->objects = 0;
  this->cavetetseglist->objects = 0;
  this->cavetetshlist->objects = 0;
  if (ivf->splitbdflag != 0) {
    if ((splitseg != (face *)0x0) && (splitseg->sh != (shellface *)0x0)) {
      puVar1 = (uint *)((long)splitseg->sh + (long)this->shmarkindex * 4 + 4);
      *puVar1 = *puVar1 & 0xfffffffd;
    }
    paVar2 = this->caveshlist;
    lVar6 = 0;
    lVar5 = paVar2->objects;
    if (paVar2->objects < 1) {
      lVar5 = lVar6;
    }
    for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      puVar1 = (uint *)(*(long *)(paVar2->toparray
                                  [(uint)lVar6 >> ((byte)paVar2->log2objectsperblock & 0x1f)] +
                                 (long)paVar2->objectbytes *
                                 (long)(int)(paVar2->objectsperblockmark & (uint)lVar6)) + 4 +
                       (long)this->shmarkindex * 4);
      *puVar1 = *puVar1 & 0xfffffffd;
    }
    paVar2->objects = 0;
    this->cavesegshlist->objects = 0;
  }
  return;
}

Assistant:

void tetgenmesh::insertpoint_abort(face *splitseg, insertvertexflags *ivf)
{
  triface *cavetet;
  face *parysh;
  int i;

  for (i = 0; i < caveoldtetlist->objects; i++) {
    cavetet = (triface *) fastlookup(caveoldtetlist, i);
    uninfect(*cavetet);
    unmarktest(*cavetet);
  }
  for (i = 0; i < cavebdrylist->objects; i++) {
    cavetet = (triface *) fastlookup(cavebdrylist, i);
    unmarktest(*cavetet); 
  }
  cavetetlist->restart();
  cavebdrylist->restart();
  caveoldtetlist->restart();
  cavetetseglist->restart();
  cavetetshlist->restart();
  if (ivf->splitbdflag) { 
    if ((splitseg != NULL) && (splitseg->sh != NULL)) {
      sunmarktest(*splitseg);
    }
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      sunmarktest(*parysh);
    }
    caveshlist->restart();
    cavesegshlist->restart();
  }
}